

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

_Bool check_bitmap_from_range(uint32_t min,uint64_t max,uint32_t step)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  ulong uVar2;
  char *internal_reason_buf;
  char *local_38;
  
  r = roaring_bitmap_from_range((ulong)min,max,step);
  _assert_true((unsigned_long)r,"result",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x46c);
  r_00 = roaring_bitmap_create_with_capacity(0);
  _assert_true((unsigned_long)r_00,"expected",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x46e);
  if (min < max) {
    uVar2 = (ulong)min;
    do {
      roaring_bitmap_add(r_00,(uint32_t)uVar2);
      uVar2 = (ulong)((uint32_t)uVar2 + step);
    } while (uVar2 < max);
  }
  local_38 = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r,&local_38);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_38);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x472);
  }
  local_38 = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r_00,&local_38);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_38);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x473);
  }
  _Var1 = roaring_bitmap_equals(r_00,r);
  if (!_Var1) {
    fprintf(_stderr,"[ERROR] check_bitmap_from_range(%u, %u, %u)\n",(ulong)min,max & 0xffffffff,
            (ulong)step);
  }
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return _Var1;
}

Assistant:

bool check_bitmap_from_range(uint32_t min, uint64_t max, uint32_t step) {
    roaring_bitmap_t *result = roaring_bitmap_from_range(min, max, step);
    assert_non_null(result);
    roaring_bitmap_t *expected = roaring_bitmap_create();
    assert_non_null(expected);
    for (uint32_t value = min; value < max; value += step) {
        roaring_bitmap_add(expected, value);
    }
    assert_bitmap_validate(result);
    assert_bitmap_validate(expected);
    bool is_equal = roaring_bitmap_equals(expected, result);
    if (!is_equal) {
        fprintf(stderr, "[ERROR] check_bitmap_from_range(%u, %u, %u)\n",
                (unsigned)min, (unsigned)max, (unsigned)step);
    }
    roaring_bitmap_free(expected);
    roaring_bitmap_free(result);
    return is_equal;
}